

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

EdgeSensitivePathSuffixSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::EdgeSensitivePathSuffixSyntax,slang::parsing::Token&,slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,SeparatedSyntaxList<slang::syntax::NameSyntax> *args_1,
          Token *args_2,Token *args_3,ExpressionSyntax *args_4,Token *args_5)

{
  Token openParen;
  Token colon;
  Token closeParen;
  EdgeSensitivePathSuffixSyntax *pEVar1;
  undefined8 *in_RCX;
  undefined8 in_RDX;
  undefined8 unaff_RBX;
  Token *in_RSI;
  ExpressionSyntax *in_RDI;
  Info *in_R8;
  undefined8 in_R9;
  Info *unaff_retaddr;
  size_t in_stack_ffffffffffffff68;
  size_t in_stack_ffffffffffffff70;
  BumpAllocator *in_stack_ffffffffffffff78;
  
  pEVar1 = (EdgeSensitivePathSuffixSyntax *)
           allocate(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  openParen.info = in_R8;
  openParen.kind = (short)in_R9;
  openParen._2_1_ = (char)((ulong)in_R9 >> 0x10);
  openParen.numFlags.raw = (char)((ulong)in_R9 >> 0x18);
  openParen.rawLen = (int)((ulong)in_R9 >> 0x20);
  colon.info = (Info *)in_RSI;
  colon.kind = (short)in_RDX;
  colon._2_1_ = (char)((ulong)in_RDX >> 0x10);
  colon.numFlags.raw = (char)((ulong)in_RDX >> 0x18);
  colon.rawLen = (int)((ulong)in_RDX >> 0x20);
  closeParen.info = unaff_retaddr;
  closeParen.kind = (short)unaff_RBX;
  closeParen._2_1_ = (char)((ulong)unaff_RBX >> 0x10);
  closeParen.numFlags.raw = (char)((ulong)unaff_RBX >> 0x18);
  closeParen.rawLen = (int)((ulong)unaff_RBX >> 0x20);
  slang::syntax::EdgeSensitivePathSuffixSyntax::EdgeSensitivePathSuffixSyntax
            ((EdgeSensitivePathSuffixSyntax *)in_RCX[1],openParen,
             (SeparatedSyntaxList<slang::syntax::NameSyntax> *)*in_RCX,*in_RSI,colon,in_RDI,
             closeParen);
  return pEVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }